

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Content * build_model(XML_Parser parser)

{
  XML_Content *pXStack_30;
  int allocsize;
  char *str;
  XML_Content *cpos;
  XML_Content *ret;
  XML_Parser parser_local;
  
  ret = (XML_Content *)parser;
  cpos = (XML_Content *)
         (**(code **)((long)parser + 0x18))
                   ((long)(*(int *)((long)parser + 0x3b8) * 0x20 + *(int *)((long)parser + 0x3b0)));
  if (cpos == (XML_Content *)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    pXStack_30 = cpos + *(uint *)&ret[0x1d].children;
    str = (char *)(cpos + 1);
    build_node(ret,0,cpos,(XML_Content **)&str,(char **)&stack0xffffffffffffffd0);
    parser_local = cpos;
  }
  return (XML_Content *)parser_local;
}

Assistant:

static XML_Content *
build_model (XML_Parser parser)
{
  XML_Content *ret;
  XML_Content *cpos;
  char * str;
  int allocsize = dtd.scaffCount * sizeof(XML_Content) + dtd.contentStringLen;
  
  ret = MALLOC(allocsize);
  if (! ret)
    return 0;

  str =  (char *) (&ret[dtd.scaffCount]);
  cpos = &ret[1];

  build_node(parser, 0, ret, &cpos, &str);
  return ret;
}